

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O2

void __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::removeVertex
          (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this,size_t v)

{
  pointer pmVar1;
  _Base_ptr p_Var2;
  size_t local_28;
  
  pmVar1 = (this->vertices_).
           super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_28 = v;
  for (p_Var2 = *(_Base_ptr *)((long)&pmVar1[v]._M_t._M_impl.super__Rb_tree_header + 0x10);
      p_Var2 != &pmVar1[v]._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
    ::erase(&(this->vertices_).
             super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*(long *)(p_Var2 + 1)]._M_t,&local_28);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  ::clear(&(this->vertices_).
           super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_28]._M_t);
  return;
}

Assistant:

inline void removeVertex(size_t v)
    {
        for (auto& p : vertices_[v])
            vertices_[p.first].erase(v);

        vertices_[v].clear();
    }